

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void __thiscall SDT::Program::~Program(Program *this)

{
  Program *this_local;
  
  SDTNode::~SDTNode(&this->super_SDTNode);
  return;
}

Assistant:

virtual void dfs(TreeNode &treeNode,SDTNode *fa){
            if(treeNode.sons.empty()) return;

            offset=0;
            Decls *decls_1 = new Decls;
            Stmts *stmts_1 = new Stmts;
            sons.push_back(decls_1);
            sons.push_back(stmts_1);
            decls_1->dfs(SON(0));
            stmts_1->dfs(SON(1));
        }